

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O3

int mbedtls_asn1_write_mpi(uchar **p,uchar *start,mbedtls_mpi *X)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  
  sVar4 = mbedtls_mpi_size(X);
  sVar4 = sVar4 + (sVar4 == 0);
  puVar1 = *p;
  iVar5 = -0x6c;
  iVar2 = iVar5;
  if ((start <= puVar1) && (sVar4 <= (ulong)((long)puVar1 - (long)start))) {
    *p = puVar1 + -sVar4;
    iVar2 = mbedtls_mpi_write_binary(X,puVar1 + -sVar4,sVar4);
    if (iVar2 == 0) {
      if ((X->s == 1) && (puVar1 = *p, (char)*puVar1 < '\0')) {
        if (puVar1 == start || (long)puVar1 - (long)start < 0) {
          return -0x6c;
        }
        *p = puVar1 + -1;
        puVar1[-1] = '\0';
        sVar4 = sVar4 + 1;
      }
      iVar3 = mbedtls_asn1_write_len(p,start,sVar4);
      iVar2 = iVar3;
      if ((-1 < iVar3) &&
         (puVar1 = *p, iVar2 = iVar5, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
        *p = puVar1 + -1;
        puVar1[-1] = '\x02';
        iVar2 = (int)sVar4 + iVar3 + 1;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_mpi(unsigned char **p, const unsigned char *start, const mbedtls_mpi *X)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    // Write the MPI
    //
    len = mbedtls_mpi_size(X);

    /* DER represents 0 with a sign bit (0=nonnegative) and 7 value bits, not
     * as 0 digits. We need to end up with 020100, not with 0200. */
    if (len == 0) {
        len = 1;
    }

    if (*p < start || (size_t) (*p - start) < len) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    (*p) -= len;
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(X, *p, len));

    // DER format assumes 2s complement for numbers, so the leftmost bit
    // should be 0 for positive numbers and 1 for negative numbers.
    //
    if (X->s == 1 && **p & 0x80) {
        if (*p - start < 1) {
            return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
        }

        *--(*p) = 0x00;
        len += 1;
    }

    ret = mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_INTEGER);

cleanup:
    return ret;
}